

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O2

void __thiscall bytearray_undo_rec::apply_undo(bytearray_undo_rec *this,CVmObjByteArray *arr)

{
  bytearray_undo_bytes *pbVar1;
  unsigned_long uVar2;
  unsigned_long idx;
  size_t len;
  
  pbVar1 = (bytearray_undo_bytes *)&this->save_head_;
  idx = this->idx_;
  for (uVar2 = this->cnt_; uVar2 != 0; uVar2 = uVar2 - len) {
    pbVar1 = pbVar1->nxt_;
    len = 0x8000;
    if (uVar2 < 0x8000) {
      len = uVar2;
    }
    CVmObjByteArray::copy_from_buf(arr,pbVar1->buf_,idx,len);
    idx = idx + len;
  }
  return;
}

Assistant:

void apply_undo(CVmObjByteArray *arr)
    {
        bytearray_undo_bytes *cur;
        unsigned long idx;
        unsigned long rem;

        /* delete our list of saved byte blocks */
        for (cur = save_head_, idx = idx_, rem = cnt_ ; rem != 0 ; )
        {
            size_t copy_len;
            
            /* limit the copy to our block size (32k) */
            copy_len = 32768;
            if (copy_len > rem)
                copy_len = (size_t)rem;

            /* copy this block into the array */
            arr->copy_from_buf(cur->buf_, idx, copy_len);

            /* move past the copied data */
            cur = cur->nxt_;
            idx += copy_len;
            rem -= copy_len;
        }
    }